

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase266::run(TestCase266 *this)

{
  unsigned_long *local_88;
  uint64_t *local_80;
  bool local_71;
  uint64_t *puStack_70;
  bool _kj_shouldLog_1;
  unsigned_long *local_68;
  bool local_59;
  unsigned_long *puStack_58;
  bool _kj_shouldLog;
  uint64_t *i3;
  uint64_t *i2;
  unsigned_long *local_38;
  uint64_t *i1;
  Arena arena;
  TestCase266 *this_local;
  
  arena.currentChunk = (ChunkHeader *)this;
  Arena::Arena((Arena *)&i1,0x28);
  local_38 = Arena::allocate<unsigned_long>((Arena *)&i1);
  i3 = Arena::allocate<unsigned_long>((Arena *)&i1);
  puStack_58 = Arena::allocate<unsigned_long>((Arena *)&i1);
  if (local_38 + 1 != i3) {
    local_59 = _::Debug::shouldLog(ERROR);
    while (local_59 != false) {
      local_68 = local_38 + 1;
      puStack_70 = i3;
      _::Debug::log<char_const(&)[36],unsigned_long*,unsigned_long*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x112,ERROR,"\"failed: expected \" \"(&i1 + 1) == (&i2)\", &i1 + 1, &i2",
                 (char (*) [36])"failed: expected (&i1 + 1) == (&i2)",&local_68,
                 &stack0xffffffffffffff90);
      local_59 = false;
    }
  }
  if (i3 + 1 == puStack_58) {
    local_71 = _::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      local_80 = i3 + 1;
      local_88 = puStack_58;
      _::Debug::log<char_const(&)[36],unsigned_long*,unsigned_long*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x113,ERROR,"\"failed: expected \" \"(&i2 + 1) != (&i3)\", &i2 + 1, &i3",
                 (char (*) [36])"failed: expected (&i2 + 1) != (&i3)",&local_80,&local_88);
      local_71 = false;
    }
  }
  *local_38 = 0x4d2;
  *i3 = 0x162e;
  *puStack_58 = 0x2334;
  Arena::~Arena((Arena *)&i1);
  return;
}

Assistant:

TEST(Arena, MultiSegment) {
  // Sorry, this test makes assumptions about the size of ChunkHeader.
  Arena arena(sizeof(void*) == 4 ? 32 : 40);

  uint64_t& i1 = arena.allocate<uint64_t>();
  uint64_t& i2 = arena.allocate<uint64_t>();
  uint64_t& i3 = arena.allocate<uint64_t>();

  EXPECT_EQ(&i1 + 1, &i2);
  EXPECT_NE(&i2 + 1, &i3);

  i1 = 1234;
  i2 = 5678;
  i3 = 9012;
}